

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O0

void __thiscall
OpenMD::GCNSeq::GCNSeq
          (GCNSeq *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType rCut,
          int bins)

{
  bool bVar1;
  ostream *poVar2;
  SequentialAnalyzer *this_00;
  string *params_00;
  SimInfo *in_RSI;
  char *in_RDI;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  string paramString;
  stringstream params;
  RealType binMax_;
  string *in_stack_fffffffffffffd48;
  SequentialAnalyzer *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  string local_260 [32];
  stringstream local_240 [16];
  ostream local_230 [64];
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  SimInfo *in_stack_fffffffffffffe28;
  SequentialAnalyzer *in_stack_fffffffffffffe30;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [36];
  undefined4 local_34;
  undefined8 local_30;
  SimInfo *local_10;
  
  local_34 = in_R9D;
  local_30 = in_XMM0_Qa;
  local_10 = in_RSI;
  SequentialAnalyzer::SequentialAnalyzer
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  *(undefined ***)in_RDI = &PTR__GCNSeq_00394bd8;
  *(undefined8 *)(in_RDI + 0xd48) = local_30;
  *(undefined4 *)(in_RDI + 0xd50) = local_34;
  __a = (allocator<char> *)(in_RDI + 0xd70);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x137640);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xd88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x137656);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  SequentialAnalyzer::setSequenceType(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  getPrefix(in_stack_fffffffffffffd58);
  std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
  SequentialAnalyzer::setOutputName(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  in_RDI[0xd58] = '\f';
  in_RDI[0xd59] = '\0';
  in_RDI[0xd5a] = '\0';
  in_RDI[0xd5b] = '\0';
  *(double *)(in_RDI + 0xd60) =
       ((double)*(int *)(in_RDI + 0xd58) * 1.5) / (double)*(int *)(in_RDI + 0xd50);
  SimInfo::getSimParams(local_10);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x13777b);
  in_RDI[0xd54] = bVar1;
  std::__cxx11::stringstream::stringstream(local_240);
  poVar2 = std::operator<<(local_230," rcut = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(in_RDI + 0xd48));
  poVar2 = std::operator<<(poVar2,", nbins = ");
  this_00 = (SequentialAnalyzer *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0xd50));
  params_00 = (string *)std::operator<<((ostream *)this_00,", max neighbors = ");
  std::ostream::operator<<(params_00,*(int *)(in_RDI + 0xd58));
  std::__cxx11::stringstream::str();
  SequentialAnalyzer::setParameterString(this_00,params_00);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::stringstream::~stringstream(local_240);
  return;
}

Assistant:

GCNSeq::GCNSeq(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 RealType rCut, int bins) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      rCut_(rCut), bins_(bins) {
    setSequenceType("Generalized Coordination Number Distribution");
    setOutputName(getPrefix(filename) + ".gcnSeq");

    nnMax_           = 12;
    RealType binMax_ = nnMax_ * 1.5;
    delta_           = binMax_ / bins_;
    usePBC_          = info->getSimParams()->getUsePeriodicBoundaryConditions();

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << bins_
           << ", max neighbors = " << nnMax_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }